

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

bool __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::eval_boolean
          (xpath_ast_node *this,xpath_context *c,xpath_stack *stack)

{
  char cVar1;
  char cVar2;
  byte bVar3;
  double dVar4;
  bool bVar5;
  int iVar6;
  char *pcVar7;
  xpath_variable *pxVar8;
  xml_attribute xVar9;
  byte *pbVar10;
  long lVar11;
  xpath_variable *__s2;
  xpath_ast_node *pxVar12;
  xpath_ast_node *this_00;
  byte *pbVar13;
  xpath_ast_node *pxVar14;
  byte bVar15;
  char_t *__s1;
  less_equal *in_R8;
  byte bVar16;
  xml_node_struct *pxVar17;
  xpath_memory_block *pxVar18;
  undefined1 uVar19;
  xpath_node *pxVar20;
  bool bVar21;
  double v;
  xpath_allocator_capture local_f8;
  undefined1 local_d4;
  undefined3 uStack_d3;
  byte *local_d0;
  xpath_node_set_raw local_c8;
  xpath_node_set_raw local_a8;
  double local_88;
  xpath_allocator_capture local_80;
  xpath_string local_60;
  xpath_string local_48;
  
  local_d4 = xpath_type_none;
  uStack_d3 = 0;
LAB_0015e4f0:
  cVar1 = this->_type;
  uVar19 = xpath_type_node_set;
  switch(cVar1) {
  case '\x01':
    bVar21 = eval_boolean(this->_left,c,stack);
    if (!bVar21) goto LAB_0015e558;
    goto switchD_0015e537_caseD_2f;
  case '\x02':
    bVar21 = eval_boolean(this->_left,c,stack);
    if (!bVar21) goto switchD_0015e537_caseD_30;
LAB_0015e558:
    this = this->_right;
    goto LAB_0015e4f0;
  case '\x03':
    goto switchD_0015e508_caseD_3;
  case '\x04':
    pxVar12 = this->_left;
    this = this->_right;
    cVar1 = pxVar12->_rettype;
    cVar2 = this->_rettype;
    if ((cVar1 == '\x01') || (cVar2 == '\x01')) {
      if (cVar2 == '\x01' && cVar1 == '\x01') {
        local_f8._target = stack->result;
        local_f8._state._root = (local_f8._target)->_root;
        local_f8._state._root_size = (local_f8._target)->_root_size;
        local_f8._state._error = (local_f8._target)->_error;
        eval_node_set(&local_c8,pxVar12,c,stack,nodeset_eval_all);
        eval_node_set(&local_a8,this,c,stack,nodeset_eval_all);
        uVar19 = local_c8._begin != local_c8._end;
        if (!(bool)uVar19) goto LAB_0015eb99;
        uVar19 = true;
        pxVar18 = (xpath_memory_block *)local_a8._begin;
        pxVar20 = local_c8._begin;
        goto LAB_0015eea4;
      }
      pxVar14 = pxVar12;
      if (cVar1 == '\x01') {
        pxVar14 = this;
        cVar1 = cVar2;
        this = pxVar12;
      }
      if (cVar1 == '\x02') {
        local_f8._target = stack->result;
        local_f8._state._root = (local_f8._target)->_root;
        local_f8._state._root_size = (local_f8._target)->_root_size;
        local_f8._state._error = (local_f8._target)->_error;
        local_88 = eval_number(pxVar14,c,stack);
        eval_node_set(&local_c8,this,c,stack,nodeset_eval_all);
        uVar19 = local_c8._begin != local_c8._end;
        if (local_c8._begin == local_c8._end) goto LAB_0015eb99;
        uVar19 = true;
        pxVar20 = local_c8._begin;
        goto LAB_0015f15d;
      }
      if (cVar1 != '\x03') {
        if (cVar1 != '\x04') goto switchD_0015e537_caseD_30;
        bVar21 = eval_boolean(pxVar14,c,stack);
        bVar5 = eval_boolean(this,c,stack);
        uVar19 = bVar5 != bVar21;
        goto switchD_0015e537_caseD_2f;
      }
      local_f8._target = stack->result;
      local_f8._state._root = (local_f8._target)->_root;
      local_f8._state._root_size = (local_f8._target)->_root_size;
      local_f8._state._error = (local_f8._target)->_error;
      eval_string((xpath_string *)&local_80,pxVar14,c,stack);
      eval_node_set(&local_c8,this,c,stack,nodeset_eval_all);
      uVar19 = local_c8._begin != local_c8._end;
      if (local_c8._begin == local_c8._end) goto LAB_0015eb99;
      uVar19 = true;
      pxVar20 = local_c8._begin;
      goto LAB_0015f092;
    }
    if (cVar1 != '\x04' && cVar2 != '\x04') {
      if (cVar1 != '\x02' && cVar2 != '\x02') {
        if (cVar1 == '\x03' || cVar2 == '\x03') {
          local_f8._target = stack->result;
          local_f8._state._root = (local_f8._target)->_root;
          local_f8._state._root_size = (local_f8._target)->_root_size;
          local_f8._state._error = (local_f8._target)->_error;
          eval_string((xpath_string *)&local_c8,pxVar12,c,stack);
          eval_string((xpath_string *)&local_a8,this,c,stack);
          iVar6 = strcmp((char *)local_c8._0_8_,(char *)local_a8._0_8_);
          bVar21 = iVar6 == 0;
          goto LAB_0015e9dd;
        }
        goto switchD_0015e537_caseD_30;
      }
      local_d0 = (byte *)eval_number(pxVar12,c,stack);
      dVar4 = eval_number(this,c,stack);
      uVar19 = dVar4 != (double)local_d0;
      goto switchD_0015e537_caseD_2f;
    }
    bVar21 = eval_boolean(pxVar12,c,stack);
    local_d4 = local_d4 ^ bVar21;
    goto LAB_0015e4f0;
  case '\x05':
    pxVar14 = this->_left;
    pxVar12 = this->_right;
    goto LAB_0015e6f7;
  case '\x06':
    pxVar12 = this->_left;
    pxVar14 = this->_right;
LAB_0015e6f7:
    uVar19 = compare_rel<pugi::impl::(anonymous_namespace)::less>
                       (pxVar14,pxVar12,c,stack,(less *)in_R8);
    goto switchD_0015e537_caseD_2f;
  case '\a':
    pxVar14 = this->_left;
    pxVar12 = this->_right;
    goto LAB_0015e6e0;
  case '\b':
    pxVar12 = this->_left;
    pxVar14 = this->_right;
LAB_0015e6e0:
    uVar19 = compare_rel<pugi::impl::(anonymous_namespace)::less_equal>
                       (pxVar14,pxVar12,c,stack,in_R8);
    goto switchD_0015e537_caseD_2f;
  case '\t':
  case '\n':
  case '\v':
  case '\f':
  case '\r':
  case '\x0e':
  case '\x0f':
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x13':
    break;
  case '\x14':
    if (this->_rettype == '\x04') {
      if (((this->_data).variable)->_type != xpath_type_boolean) goto switchD_0015e537_caseD_30;
      uVar19 = (undefined1)(this->_data).variable[1]._type;
      goto switchD_0015e537_caseD_2f;
    }
    break;
  default:
    switch(cVar1) {
    case '\"':
      local_f8._target = stack->result;
      local_f8._state._root = (local_f8._target)->_root;
      local_f8._state._root_size = (local_f8._target)->_root_size;
      local_f8._state._error = (local_f8._target)->_error;
      eval_string((xpath_string *)&local_c8,this->_left,c,stack);
      eval_string((xpath_string *)&local_a8,this->_right,c,stack);
      uVar19 = *(byte *)(xpath_memory_block **)local_a8._0_8_ == 0;
      if ((bool)uVar19) goto LAB_0015eb99;
      if (*(byte *)local_c8._0_8_ != *(byte *)(xpath_memory_block **)local_a8._0_8_)
      goto LAB_0015eb96;
      lVar11 = 1;
      goto LAB_0015e83f;
    case '#':
      local_f8._target = stack->result;
      local_f8._state._root = (local_f8._target)->_root;
      local_f8._state._root_size = (local_f8._target)->_root_size;
      local_f8._state._error = (local_f8._target)->_error;
      eval_string((xpath_string *)&local_c8,this->_left,c,stack);
      eval_string((xpath_string *)&local_a8,this->_right,c,stack);
      pcVar7 = strstr((char *)local_c8._0_8_,(char *)local_a8._0_8_);
      bVar21 = pcVar7 == (char *)0x0;
      goto LAB_0015e9dd;
    case '$':
    case '%':
    case '&':
    case '\'':
    case '(':
    case ')':
    case '*':
    case '+':
    case ',':
      break;
    case '-':
      goto switchD_0015e537_caseD_2d;
    case '.':
      bVar21 = eval_boolean(this->_left,c,stack);
      goto LAB_0015e76d;
    case '/':
      goto switchD_0015e537_caseD_2f;
    case '0':
      goto switchD_0015e537_caseD_30;
    case '1':
      if ((c->n)._attribute._attr != (xml_attribute_struct *)0x0) goto switchD_0015e537_caseD_30;
      local_f8._target = stack->result;
      local_f8._state._root = (local_f8._target)->_root;
      local_f8._state._root_size = (local_f8._target)->_root_size;
      local_f8._state._error = (local_f8._target)->_error;
      eval_string((xpath_string *)&local_c8,this->_left,c,stack);
      uVar19 = false;
      if ((c->n)._attribute._attr == (xml_attribute_struct *)0x0) {
        pxVar17 = (c->n)._node._root;
      }
      else {
        pxVar17 = (xml_node_struct *)0x0;
      }
      local_a8._0_8_ = pxVar17;
      if (pxVar17 == (xml_node_struct *)0x0) goto LAB_0015eb99;
      local_d0 = (byte *)(local_c8._0_8_ + 1);
      goto LAB_0015eaaf;
    default:
      if (cVar1 == ';') {
        __s2 = (this->_right->_data).variable;
        if (this->_right->_type != '\x12') {
          if (__s2->_type == xpath_type_string) {
            pxVar8 = *(xpath_variable **)(__s2 + 1);
          }
          else {
            pxVar8 = (xpath_variable *)0x0;
          }
          __s2 = (xpath_variable *)0x16ad89;
          if (pxVar8 != (xpath_variable *)0x0) {
            __s2 = pxVar8;
          }
        }
        uVar19 = xpath_type_none;
        if ((c->n)._attribute._attr == (xml_attribute_struct *)0x0) {
          local_f8._target = (xpath_allocator *)(c->n)._node._root;
        }
        else {
          local_f8._target = (xpath_allocator *)0x0;
        }
        xVar9 = xml_node::attribute((xml_node *)&local_f8,(this->_left->_data).string);
        if (xVar9._attr == (xml_attribute_struct *)0x0) goto switchD_0015e537_caseD_2f;
        __s1 = (xVar9._attr)->value;
        if (__s1 == (char_t *)0x0) {
          __s1 = "";
        }
        iVar6 = strcmp(__s1,(char *)__s2);
        if (iVar6 != 0) goto switchD_0015e537_caseD_30;
        pcVar7 = "";
        if ((xVar9._attr)->name != (char_t *)0x0) {
          pcVar7 = (xVar9._attr)->name;
        }
        uVar19 = is_xpath_attribute(pcVar7);
        goto switchD_0015e537_caseD_2f;
      }
    }
  }
  cVar1 = this->_rettype;
  if (cVar1 == '\x01') {
    local_f8._target = stack->result;
    local_f8._state._root = (local_f8._target)->_root;
    local_f8._state._root_size = (local_f8._target)->_root_size;
    local_f8._state._error = (local_f8._target)->_error;
    eval_node_set(&local_c8,this,c,stack,nodeset_eval_any);
    bVar21 = local_c8._begin == local_c8._end;
  }
  else {
    if (cVar1 != '\x03') {
      if (cVar1 != '\x02') goto switchD_0015e537_caseD_30;
      dVar4 = eval_number(this,c,stack);
      if ((dVar4 == 0.0) && (!NAN(dVar4))) goto switchD_0015e537_caseD_30;
      uVar19 = xpath_type_node_set;
      goto switchD_0015e537_caseD_2f;
    }
    local_f8._target = stack->result;
    local_f8._state._root = (local_f8._target)->_root;
    local_f8._state._root_size = (local_f8._target)->_root_size;
    local_f8._state._error = (local_f8._target)->_error;
    eval_string((xpath_string *)&local_c8,this,c,stack);
    bVar21 = *(byte *)local_c8._0_8_ == 0;
  }
LAB_0015e9dd:
  uVar19 = !bVar21;
  goto LAB_0015eb99;
  while (pxVar17 = pxVar17->parent, local_a8._0_8_ = pxVar17, pxVar17 != (xml_node_struct *)0x0) {
LAB_0015eaaf:
    local_a8._0_8_ = pxVar17;
    xVar9 = xml_node::attribute((xml_node *)&local_a8,"xml:lang");
    if (xVar9._attr != (xml_attribute_struct *)0x0) {
      pbVar10 = (byte *)(xVar9._attr)->value;
      if (pbVar10 == (byte *)0x0) {
        pbVar10 = (byte *)0x16ad89;
      }
      bVar3 = *(byte *)local_c8._0_8_;
      bVar21 = bVar3 == 0;
      if (!bVar21) {
        bVar15 = bVar3 | 0x20;
        if (0x19 < (int)(char)bVar3 - 0x41U) {
          bVar15 = bVar3;
        }
        bVar3 = *pbVar10;
        bVar16 = bVar3 | 0x20;
        if (0x19 < (int)(char)bVar3 - 0x41U) {
          bVar16 = bVar3;
        }
        pbVar13 = local_d0;
        if (bVar15 == bVar16) {
          do {
            pbVar10 = pbVar10 + 1;
            bVar3 = *pbVar13;
            bVar21 = bVar3 == 0;
            if (bVar21) goto LAB_0015eb69;
            bVar15 = bVar3 | 0x20;
            if (0x19 < (int)(char)bVar3 - 0x41U) {
              bVar15 = bVar3;
            }
            bVar3 = *pbVar10;
            bVar16 = bVar3 | 0x20;
            if (0x19 < (int)(char)bVar3 - 0x41U) {
              bVar16 = bVar3;
            }
            pbVar13 = pbVar13 + 1;
          } while (bVar15 == bVar16);
        }
        uVar19 = false;
      }
LAB_0015eb69:
      if (bVar21) {
        uVar19 = *pbVar10 == 0x2d || *pbVar10 == 0;
      }
    }
    if (xVar9._attr != (xml_attribute_struct *)0x0) goto LAB_0015eb99;
  }
  goto LAB_0015eb96;
switchD_0015e537_caseD_2d:
  this = this->_left;
  goto LAB_0015e4f0;
  while (pbVar10 = (byte *)(local_c8._0_8_ + lVar11), lVar11 = lVar11 + 1, *pbVar10 == bVar3) {
LAB_0015e83f:
    bVar3 = *(byte *)((long)(xpath_memory_block **)local_a8._0_8_ + lVar11);
    uVar19 = bVar3 == 0;
    if ((bool)uVar19) goto LAB_0015eb99;
  }
LAB_0015eb96:
  uVar19 = false;
  goto LAB_0015eb99;
  while( true ) {
    pxVar20 = pxVar20 + 1;
    uVar19 = pxVar20 != local_c8._end;
    pxVar18 = (xpath_memory_block *)local_a8._begin;
    if (!(bool)uVar19) break;
LAB_0015eea4:
    if (pxVar18 != (xpath_memory_block *)local_a8._end) {
      local_80._target = stack->result;
      local_80._state._error = (local_80._target)->_error;
      local_80._state._root = (local_80._target)->_root;
      local_80._state._root_size = (local_80._target)->_root_size;
      string_value(&local_60,pxVar20,local_80._target);
      string_value(&local_48,(xpath_node *)pxVar18,stack->result);
      iVar6 = strcmp(local_60._buffer,local_48._buffer);
      xpath_allocator_capture::~xpath_allocator_capture(&local_80);
      if (iVar6 != 0) break;
      pxVar18 = (xpath_memory_block *)&pxVar18->field_2;
      goto LAB_0015eea4;
    }
  }
  goto LAB_0015eb99;
  while( true ) {
    pxVar20 = pxVar20 + 1;
    uVar19 = pxVar20 != local_c8._end;
    if (!(bool)uVar19) break;
LAB_0015f15d:
    local_a8._0_8_ = stack->result;
    local_a8._eos = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->value;
    local_a8._begin = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->header;
    local_a8._end = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->name;
    string_value((xpath_string *)&local_80,pxVar20,(xpath_allocator *)local_a8._0_8_);
    local_d0 = (byte *)convert_string_to_number((char_t *)local_80._target);
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&local_a8);
    if ((local_88 != (double)local_d0) || (NAN(local_88) || NAN((double)local_d0))) break;
  }
  goto LAB_0015eb99;
switchD_0015e508_caseD_3:
  pxVar12 = this->_left;
  pxVar14 = this->_right;
  cVar1 = pxVar12->_rettype;
  cVar2 = pxVar14->_rettype;
  if (cVar2 == '\x01' || cVar1 == '\x01') {
    if (cVar2 == '\x01' && cVar1 == '\x01') {
      local_f8._target = stack->result;
      local_f8._state._root = (local_f8._target)->_root;
      local_f8._state._root_size = (local_f8._target)->_root_size;
      local_f8._state._error = (local_f8._target)->_error;
      eval_node_set(&local_c8,pxVar12,c,stack,nodeset_eval_all);
      eval_node_set(&local_a8,pxVar14,c,stack,nodeset_eval_all);
      uVar19 = local_c8._begin != local_c8._end;
      if ((bool)uVar19) {
        uVar19 = true;
        pxVar18 = (xpath_memory_block *)local_a8._begin;
        pxVar20 = local_c8._begin;
        do {
          for (; pxVar18 != (xpath_memory_block *)local_a8._end;
              pxVar18 = (xpath_memory_block *)&pxVar18->field_2) {
            local_80._target = stack->result;
            local_80._state._error = (local_80._target)->_error;
            local_80._state._root = (local_80._target)->_root;
            local_80._state._root_size = (local_80._target)->_root_size;
            string_value(&local_60,pxVar20,local_80._target);
            string_value(&local_48,(xpath_node *)pxVar18,stack->result);
            iVar6 = strcmp(local_60._buffer,local_48._buffer);
            xpath_allocator_capture::~xpath_allocator_capture(&local_80);
            if (iVar6 == 0) goto LAB_0015eb99;
          }
          pxVar20 = pxVar20 + 1;
          uVar19 = pxVar20 != local_c8._end;
          pxVar18 = (xpath_memory_block *)local_a8._begin;
        } while ((bool)uVar19);
      }
    }
    else {
      this_00 = pxVar12;
      if (cVar1 == '\x01') {
        this_00 = pxVar14;
        cVar1 = cVar2;
        pxVar14 = pxVar12;
      }
      if (cVar1 == '\x02') {
        local_f8._target = stack->result;
        local_f8._state._root = (local_f8._target)->_root;
        local_f8._state._root_size = (local_f8._target)->_root_size;
        local_f8._state._error = (local_f8._target)->_error;
        local_88 = eval_number(this_00,c,stack);
        eval_node_set(&local_c8,pxVar14,c,stack,nodeset_eval_all);
        uVar19 = local_c8._begin != local_c8._end;
        if ((bool)uVar19) {
          uVar19 = true;
          pxVar20 = local_c8._begin;
          do {
            local_a8._0_8_ = stack->result;
            local_a8._eos = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->value;
            local_a8._begin = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->header;
            local_a8._end = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->name;
            string_value((xpath_string *)&local_80,pxVar20,(xpath_allocator *)local_a8._0_8_);
            local_d0 = (byte *)convert_string_to_number((char_t *)local_80._target);
            xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&local_a8);
            if ((local_88 == (double)local_d0) && (!NAN(local_88) && !NAN((double)local_d0))) break;
            pxVar20 = pxVar20 + 1;
            uVar19 = pxVar20 != local_c8._end;
          } while ((bool)uVar19);
        }
      }
      else {
        if (cVar1 != '\x03') {
          if (cVar1 != '\x04') goto switchD_0015e537_caseD_30;
          bVar5 = eval_boolean(this_00,c,stack);
          goto LAB_0015e62f;
        }
        local_f8._target = stack->result;
        local_f8._state._root = (local_f8._target)->_root;
        local_f8._state._root_size = (local_f8._target)->_root_size;
        local_f8._state._error = (local_f8._target)->_error;
        eval_string((xpath_string *)&local_80,this_00,c,stack);
        eval_node_set(&local_c8,pxVar14,c,stack,nodeset_eval_all);
        uVar19 = local_c8._begin != local_c8._end;
        if ((bool)uVar19) {
          uVar19 = true;
          pxVar20 = local_c8._begin;
          do {
            local_a8._0_8_ = stack->result;
            local_a8._eos = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->value;
            local_a8._begin = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->header;
            local_a8._end = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->name;
            string_value(&local_60,pxVar20,(xpath_allocator *)local_a8._0_8_);
            iVar6 = strcmp((char *)local_80._target,local_60._buffer);
            xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&local_a8);
            if (iVar6 == 0) break;
            pxVar20 = pxVar20 + 1;
            uVar19 = pxVar20 != local_c8._end;
          } while ((bool)uVar19);
        }
      }
    }
    goto LAB_0015eb99;
  }
  if (cVar2 == '\x04' || cVar1 == '\x04') {
    bVar5 = eval_boolean(pxVar12,c,stack);
LAB_0015e62f:
    bVar21 = eval_boolean(pxVar14,c,stack);
    bVar21 = (bool)(bVar21 ^ bVar5);
LAB_0015e76d:
    uVar19 = bVar21 ^ local_d4 ^ xpath_type_node_set;
    goto LAB_0015ec06;
  }
  if (cVar1 == '\x02' || cVar2 == '\x02') {
    local_d0 = (byte *)eval_number(pxVar12,c,stack);
    dVar4 = eval_number(pxVar14,c,stack);
    uVar19 = dVar4 == (double)local_d0;
  }
  else {
    if (cVar1 == '\x03' || cVar2 == '\x03') {
      local_f8._target = stack->result;
      local_f8._state._root = (local_f8._target)->_root;
      local_f8._state._root_size = (local_f8._target)->_root_size;
      local_f8._state._error = (local_f8._target)->_error;
      eval_string((xpath_string *)&local_c8,pxVar12,c,stack);
      eval_string((xpath_string *)&local_a8,pxVar14,c,stack);
      iVar6 = strcmp((char *)local_c8._0_8_,(char *)local_a8._0_8_);
      uVar19 = iVar6 == 0;
      goto LAB_0015eb99;
    }
switchD_0015e537_caseD_30:
    uVar19 = xpath_type_none;
  }
  goto switchD_0015e537_caseD_2f;
  while( true ) {
    pxVar20 = pxVar20 + 1;
    uVar19 = pxVar20 != local_c8._end;
    if (!(bool)uVar19) break;
LAB_0015f092:
    local_a8._0_8_ = stack->result;
    local_a8._eos = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->value;
    local_a8._begin = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->header;
    local_a8._end = (xpath_node *)((xml_node_struct *)local_a8._0_8_)->name;
    string_value(&local_60,pxVar20,(xpath_allocator *)local_a8._0_8_);
    iVar6 = strcmp((char *)local_80._target,local_60._buffer);
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&local_a8);
    if (iVar6 != 0) break;
  }
LAB_0015eb99:
  xpath_allocator_capture::~xpath_allocator_capture(&local_f8);
switchD_0015e537_caseD_2f:
  uVar19 = uVar19 ^ local_d4;
LAB_0015ec06:
  return (bool)(uVar19 & xpath_type_node_set);
}

Assistant:

bool eval_boolean(const xpath_context& c, const xpath_stack& stack)
		{
			switch (_type)
			{
			case ast_op_or:
				return _left->eval_boolean(c, stack) || _right->eval_boolean(c, stack);

			case ast_op_and:
				return _left->eval_boolean(c, stack) && _right->eval_boolean(c, stack);

			case ast_op_equal:
				return compare_eq(_left, _right, c, stack, equal_to());

			case ast_op_not_equal:
				return compare_eq(_left, _right, c, stack, not_equal_to());

			case ast_op_less:
				return compare_rel(_left, _right, c, stack, less());

			case ast_op_greater:
				return compare_rel(_right, _left, c, stack, less());

			case ast_op_less_or_equal:
				return compare_rel(_left, _right, c, stack, less_equal());

			case ast_op_greater_or_equal:
				return compare_rel(_right, _left, c, stack, less_equal());

			case ast_func_starts_with:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_string lr = _left->eval_string(c, stack);
				xpath_string rr = _right->eval_string(c, stack);

				return starts_with(lr.c_str(), rr.c_str());
			}

			case ast_func_contains:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_string lr = _left->eval_string(c, stack);
				xpath_string rr = _right->eval_string(c, stack);

				return find_substring(lr.c_str(), rr.c_str()) != NULL;
			}

			case ast_func_boolean:
				return _left->eval_boolean(c, stack);

			case ast_func_not:
				return !_left->eval_boolean(c, stack);

			case ast_func_true:
				return true;

			case ast_func_false:
				return false;

			case ast_func_lang:
			{
				if (c.n.attribute()) return false;

				xpath_allocator_capture cr(stack.result);

				xpath_string lang = _left->eval_string(c, stack);

				for (xml_node n = c.n.node(); n; n = n.parent())
				{
					xml_attribute a = n.attribute(PUGIXML_TEXT("xml:lang"));

					if (a)
					{
						const char_t* value = a.value();

						// strnicmp / strncasecmp is not portable
						for (const char_t* lit = lang.c_str(); *lit; ++lit)
						{
							if (tolower_ascii(*lit) != tolower_ascii(*value)) return false;
							++value;
						}

						return *value == 0 || *value == '-';
					}
				}

				return false;
			}

			case ast_opt_compare_attribute:
			{
				const char_t* value = (_right->_type == ast_string_constant) ? _right->_data.string : _right->_data.variable->get_string();

				xml_attribute attr = c.n.node().attribute(_left->_data.nodetest);

				return attr && strequal(attr.value(), value) && is_xpath_attribute(attr.name());
			}

			case ast_variable:
			{
				assert(_rettype == _data.variable->type());

				if (_rettype == xpath_type_boolean)
					return _data.variable->get_boolean();

				// variable needs to be converted to the correct type, this is handled by the fallthrough block below
				break;
			}

			default:
				;
			}

			// none of the ast types that return the value directly matched, we need to perform type conversion
			switch (_rettype)
			{
			case xpath_type_number:
				return convert_number_to_boolean(eval_number(c, stack));

			case xpath_type_string:
			{
				xpath_allocator_capture cr(stack.result);

				return !eval_string(c, stack).empty();
			}

			case xpath_type_node_set:
			{
				xpath_allocator_capture cr(stack.result);

				return !eval_node_set(c, stack, nodeset_eval_any).empty();
			}

			default:
				assert(false && "Wrong expression for return type boolean"); // unreachable
				return false;
			}
		}